

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

result __thiscall
fmt::v6::internal::fixed_handler::on_digit
          (fixed_handler *this,char digit,uint64_t divisor,uint64_t remainder,uint64_t error,
          int param_6,bool integral)

{
  bool bVar1;
  int iVar2;
  round_direction rVar3;
  uint64_t in_RCX;
  ulong in_RDX;
  long lVar4;
  undefined1 in_SIL;
  long *in_RDI;
  ulong in_R8;
  byte in_stack_00000008;
  int i;
  round_direction dir;
  int local_40;
  result local_4;
  
  lVar4 = in_RDI[1];
  *(int *)(in_RDI + 1) = (int)lVar4 + 1;
  *(undefined1 *)(*in_RDI + (long)(int)lVar4) = in_SIL;
  if ((int)in_RDI[1] < *(int *)((long)in_RDI + 0xc)) {
    local_4 = more;
  }
  else if (((in_stack_00000008 & 1) == 0) && ((in_RDX <= in_R8 || (in_RDX - in_R8 <= in_R8)))) {
    local_4 = error;
  }
  else {
    rVar3 = get_round_direction(in_RDX,in_RCX,in_R8);
    if (rVar3 == up) {
      lVar4 = (long)((int)in_RDI[1] + -1);
      *(char *)(*in_RDI + lVar4) = *(char *)(*in_RDI + lVar4) + '\x01';
      iVar2 = (int)in_RDI[1];
      while( true ) {
        local_40 = iVar2 + -1;
        bVar1 = false;
        if (0 < local_40) {
          bVar1 = '9' < *(char *)(*in_RDI + (long)local_40);
        }
        if (!bVar1) break;
        *(undefined1 *)(*in_RDI + (long)local_40) = 0x30;
        *(char *)(*in_RDI + (long)(iVar2 + -2)) = *(char *)(*in_RDI + (long)(iVar2 + -2)) + '\x01';
        iVar2 = local_40;
      }
      if ('9' < *(char *)*in_RDI) {
        *(undefined1 *)*in_RDI = 0x31;
        lVar4 = in_RDI[1];
        *(int *)(in_RDI + 1) = (int)lVar4 + 1;
        *(undefined1 *)(*in_RDI + (long)(int)lVar4) = 0x30;
      }
      local_4 = done;
    }
    else {
      local_4 = error;
      if (rVar3 == down) {
        local_4 = done;
      }
    }
  }
  return local_4;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int, bool integral) {
    FMT_ASSERT(remainder < divisor, "");
    buf[size++] = digit;
    if (size < precision) return digits::more;
    if (!integral) {
      // Check if error * 2 < divisor with overflow prevention.
      // The check is not needed for the integral part because error = 1
      // and divisor > (1 << 32) there.
      if (error >= divisor || error >= divisor - error) return digits::error;
    } else {
      FMT_ASSERT(error == 1 && divisor > 2, "");
    }
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir != up) return dir == down ? digits::done : digits::error;
    ++buf[size - 1];
    for (int i = size - 1; i > 0 && buf[i] > '9'; --i) {
      buf[i] = '0';
      ++buf[i - 1];
    }
    if (buf[0] > '9') {
      buf[0] = '1';
      buf[size++] = '0';
    }
    return digits::done;
  }